

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pub.cpp
# Opt level: O0

void __thiscall
so_5::disp::active_group::impl::
dispatcher_template_t<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>_>
::dispatcher_template_t
          (dispatcher_template_t<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>_>
           *this,disp_params_t *params)

{
  dispatcher_template_t<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>_>
  *disp;
  disp_params_t *params_local;
  dispatcher_template_t<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>_>
  *this_local;
  
  actual_disp_iface_t::actual_disp_iface_t(&this->super_actual_disp_iface_t);
  (this->super_actual_disp_iface_t).super_dispatcher_t._vptr_dispatcher_t =
       (_func_int **)&PTR__dispatcher_template_t_005c4758;
  active_group::disp_params_t::disp_params_t(&this->m_params,params);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_so_5::disp::active_group::impl::dispatcher_template_t<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>_>::thread_with_refcounter_t,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_so_5::disp::active_group::impl::dispatcher_template_t<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>_>::thread_with_refcounter_t>_>_>
  ::map(&this->m_groups);
  this->m_shutdown_started = false;
  std::mutex::mutex(&this->m_lock);
  disp = self(this);
  disp_data_source_t::disp_data_source_t(&this->m_data_source,disp);
  return;
}

Assistant:

dispatcher_template_t( disp_params_t params )
			:	m_params{ std::move(params) }
			,	m_data_source( self() )
			{}